

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  int iVar1;
  ImDrawCmd *pIVar2;
  int idx_buffer_old_size;
  int vtx_buffer_old_size;
  ImDrawCmd *draw_cmd;
  int vtx_count_local;
  int idx_count_local;
  ImDrawList *this_local;
  
  pIVar2 = (this->CmdBuffer).Data + ((this->CmdBuffer).Size + -1);
  pIVar2->ElemCount = idx_count + pIVar2->ElemCount;
  iVar1 = (this->VtxBuffer).Size;
  ImVector<ImDrawVert>::resize(&this->VtxBuffer,iVar1 + vtx_count);
  this->_VtxWritePtr = (this->VtxBuffer).Data + iVar1;
  iVar1 = (this->IdxBuffer).Size;
  ImVector<unsigned_short>::resize(&this->IdxBuffer,iVar1 + idx_count);
  this->_IdxWritePtr = (this->IdxBuffer).Data + iVar1;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    ImDrawCmd& draw_cmd = CmdBuffer.Data[CmdBuffer.Size-1];
    draw_cmd.ElemCount += idx_count;

    int vtx_buffer_old_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_old_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_old_size;

    int idx_buffer_old_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_old_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_old_size;
}